

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::resetMIDIChannelsAssignment(QSynth *this,bool engageChannel1)

{
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  bool engageChannel1_local;
  QSynth *this_local;
  
  synthLocker._15_1_ = engageChannel1;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::resetMidiChannelsAssignment(this->realtimeHelper,(bool)(synthLocker._15_1_ & 1))
    ;
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    bVar1 = isOpen(this);
    if (bVar1) {
      writeMIDIChannelsAssignmentResetSysex(this->synth,(bool)(synthLocker._15_1_ & 1));
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::resetMIDIChannelsAssignment(bool engageChannel1) {
	if (isRealtime()) {
		realtimeHelper->resetMidiChannelsAssignment(engageChannel1);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) writeMIDIChannelsAssignmentResetSysex(synth, engageChannel1);
	}
}